

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialogPrivate::textChanged(QInputDialogPrivate *this,QString *text)

{
  QObject *pQVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  void *local_38;
  QString *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  lVar2 = (this->textValue).d.size;
  if (lVar2 == (text->d).size) {
    QVar4.m_data = (text->d).ptr;
    QVar4.m_size = lVar2;
    QVar5.m_data = (this->textValue).d.ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar5,QVar4);
    if (cVar3 != '\0') goto LAB_004fd97c;
  }
  QString::operator=(&this->textValue,(QString *)text);
  local_38 = (void *)0x0;
  local_30 = text;
  QMetaObject::activate(pQVar1,&QInputDialog::staticMetaObject,0,&local_38);
LAB_004fd97c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::textChanged(const QString &text)
{
    Q_Q(QInputDialog);
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}